

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::Country::~Country(Country *this)

{
  string *this_00;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_01;
  Country *this_local;
  
  if (this->cyID != (int *)0x0) {
    operator_delete(this->cyID,4);
  }
  this_00 = this->cyName;
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00,0x20);
  }
  if (this->cyContinent != (int *)0x0) {
    operator_delete(this->cyContinent,4);
  }
  this_01 = this->pAdjCountries;
  if (this_01 != (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0) {
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::~vector(this_01);
    operator_delete(this_01,0x18);
  }
  if (this->pPlayerOwnerId != (int *)0x0) {
    operator_delete(this->pPlayerOwnerId,4);
  }
  if (this->pNumberOfTroops != (int *)0x0) {
    operator_delete(this->pNumberOfTroops,4);
  }
  return;
}

Assistant:

Map::Country::~Country() {
    delete cyID;
    delete cyName;
    delete cyContinent;
    delete pAdjCountries;
    delete pPlayerOwnerId;
    delete pNumberOfTroops;
}